

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O1

void Llb_Nonlin4SweepPrint(Vec_Ptr_t *vFuncs)

{
  uint uVar1;
  long lVar2;
  
  printf("(%d) ",(ulong)(uint)vFuncs->nSize);
  if (0 < vFuncs->nSize) {
    lVar2 = 0;
    do {
      uVar1 = Cudd_DagSize((DdNode *)vFuncs->pArray[lVar2]);
      printf("%d ",(ulong)uVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vFuncs->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Llb_Nonlin4SweepPrint( Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc;
    int i;
    printf( "(%d) ", Vec_PtrSize(vFuncs) );
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        printf( "%d ", Cudd_DagSize(bFunc) );
    printf( "\n" );
}